

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis<double,long,long_double>
                 (size_t col_num,size_t nrows,double *Xc,long *Xc_ind,long *Xc_indptr,
                 MissingAction missing_action)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long ix;
  long lVar4;
  long lVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST2;
  longdouble in_ST3;
  long local_88;
  ushort uStack_80;
  long local_78;
  ushort uStack_70;
  
  lVar4 = Xc_indptr[col_num];
  lVar1 = Xc_indptr[col_num + 1];
  if (nrows < 2 || lVar4 == lVar1) {
    return -INFINITY;
  }
  uVar3 = nrows;
  if (missing_action == Fail) {
    lVar12 = (longdouble)0;
    lVar7 = lVar12;
    lVar8 = lVar12;
    lVar9 = lVar12;
    if (lVar4 < lVar1) {
      lVar12 = (longdouble)0;
      do {
        lVar9 = in_ST2;
        lVar8 = in_ST1;
        lVar7 = in_ST0;
        lVar12 = lVar12 + (longdouble)Xc[lVar4];
        in_ST1 = in_ST3;
        in_ST2 = in_ST3;
        lVar6 = in_ST3;
        fmal();
        fmal();
        fmal();
        lVar4 = lVar4 + 1;
        in_ST0 = in_ST3;
        in_ST3 = lVar6;
      } while (lVar1 != lVar4);
    }
  }
  else {
    lVar12 = (longdouble)0;
    lVar7 = lVar12;
    lVar8 = lVar12;
    lVar9 = lVar12;
    if (lVar4 < lVar1) {
      lVar12 = (longdouble)0;
      lVar5 = lVar4;
      lVar7 = lVar12;
      lVar8 = lVar12;
      lVar9 = lVar12;
      do {
        lVar6 = (longdouble)Xc[lVar5];
        local_78 = SUB108(lVar6,0);
        uStack_70 = (ushort)((unkuint10)lVar6 >> 0x40);
        if ((NAN(Xc[lVar5])) || ((~uStack_70 & 0x7fff) == 0 && local_78 == -0x8000000000000000)) {
          uVar3 = uVar3 - 1;
        }
        else {
          lVar12 = lVar12 + lVar6;
          lVar9 = in_ST1;
          lVar6 = in_ST1;
          lVar10 = in_ST1;
          fmal();
          fmal();
          fmal();
          lVar7 = in_ST0;
          lVar8 = in_ST1;
          in_ST0 = lVar6;
          in_ST1 = lVar10;
        }
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
    if (uVar3 <= (lVar4 + nrows) - lVar1) {
      return -INFINITY;
    }
  }
  if (1 < uVar3) {
    if ((lVar7 != (longdouble)0) || (NAN(lVar7) || NAN((longdouble)0))) {
      if ((lVar7 != lVar12 * lVar12) || (NAN(lVar7) || NAN(lVar12 * lVar12))) {
        lVar6 = (longdouble)(long)uVar3 + (longdouble)(float)(&DAT_0036b0d8)[(long)uVar3 < 0];
        lVar10 = lVar12 / lVar6;
        lVar11 = lVar10 * lVar10;
        lVar13 = lVar7 / lVar6 - lVar11;
        if ((!NAN(lVar13)) &&
           (((longdouble)2.220446e-16 < lVar13 ||
            (bVar2 = check_more_than_two_unique_values<double,long>
                               (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar2)))) {
          if (lVar13 <= (longdouble)0) {
            return 0.0;
          }
          lVar12 = (lVar10 * lVar11 * lVar10 * lVar6 +
                   lVar12 * (longdouble)-4.0 * lVar11 * lVar10 +
                   lVar7 * (longdouble)6.0 * lVar11 + lVar8 * (longdouble)-4.0 * lVar10 + lVar9) /
                   (lVar13 * lVar13 * lVar6);
          uStack_80 = (ushort)((unkuint10)lVar12 >> 0x40);
          local_88 = SUB108(lVar12,0);
          if (((unkuint10)lVar12 & 0x7fff) == 0 ||
              (ushort)((uStack_80 & 0x7fff) - 1) < 0x7ffe && local_88 < 0) {
            if ((double)lVar12 <= 0.0) {
              return 0.0;
            }
            return (double)lVar12;
          }
          return -INFINITY;
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis(size_t col_num, size_t nrows,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = nrows;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            if (unlikely(is_na_or_inf(xval)))
            {
                cnt--;
            }

            else
            {
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);
            }
        }

        if (cnt <= (nrows) - (Xc_indptr[col_num+1] - Xc_indptr[col_num])) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            x_sq = square(xval);
            s1 += xval;
            s2  = std::fma(xval, xval, s2);
            s3  = std::fma(x_sq, xval, s3);
            s4  = std::fma(x_sq, x_sq, s4);
            // s1 += pw1(xval);
            // s2 += pw2(xval);
            // s3 += pw3(xval);
            // s4 += pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}